

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O2

RtAudioErrorType __thiscall RtApiAlsa::startStream(RtApiAlsa *this)

{
  StreamMutex *__mutex;
  StreamState SVar1;
  undefined8 *puVar2;
  RtAudioErrorType type;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  string asStack_48 [32];
  
  SVar1 = (this->super_RtApi).stream_.state;
  if (SVar1 == STREAM_CLOSED) {
LAB_0010e7cd:
    std::__cxx11::string::assign((char *)&(this->super_RtApi).errorText_);
  }
  else {
    if (SVar1 == STREAM_STOPPED) {
      __mutex = &(this->super_RtApi).stream_.mutex;
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      puVar2 = (undefined8 *)(this->super_RtApi).stream_.apiHandle;
      iVar4 = 0;
      if (((((this->super_RtApi).stream_.mode & ~DUPLEX) == OUTPUT) &&
          (iVar3 = snd_pcm_state(*puVar2), iVar3 != 2)) &&
         (iVar4 = snd_pcm_prepare(*puVar2), iVar4 < 0)) {
        pcVar6 = "RtApiAlsa::startStream: error preparing output pcm device, ";
LAB_0010e810:
        poVar5 = std::operator<<((ostream *)&(this->super_RtApi).errorStream_,pcVar6);
        pcVar6 = (char *)snd_strerror(iVar4);
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::operator<<(poVar5,".");
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,asStack_48);
        std::__cxx11::string::~string(asStack_48);
        *(undefined1 *)(puVar2 + 9) = 1;
        pthread_cond_signal((pthread_cond_t *)(puVar2 + 3));
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
      else {
        if (((uint)((this->super_RtApi).stream_.mode + ~OUTPUT) < 2) &&
           (*(char *)(puVar2 + 2) == '\0')) {
          iVar4 = snd_pcm_drop(puVar2[1]);
          iVar3 = snd_pcm_state(puVar2[1]);
          if ((iVar3 != 2) && (iVar4 = snd_pcm_prepare(puVar2[1]), iVar4 < 0)) {
            pcVar6 = "RtApiAlsa::startStream: error preparing input pcm device, ";
            goto LAB_0010e810;
          }
        }
        (this->super_RtApi).stream_.state = STREAM_RUNNING;
        *(undefined1 *)(puVar2 + 9) = 1;
        pthread_cond_signal((pthread_cond_t *)(puVar2 + 3));
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        if (-1 < iVar4) {
          return RTAUDIO_NO_ERROR;
        }
      }
      type = RTAUDIO_SYSTEM_ERROR;
      goto LAB_0010e7db;
    }
    if ((SVar1 == STREAM_RUNNING) || (SVar1 == STREAM_STOPPING)) goto LAB_0010e7cd;
  }
  type = RTAUDIO_WARNING;
LAB_0010e7db:
  RtApi::error(&this->super_RtApi,type);
  return type;
}

Assistant:

RtAudioErrorType RtApiAlsa :: startStream()
{
  // This method calls snd_pcm_prepare if the device isn't already in that state.

  if ( stream_.state != STREAM_STOPPED ) {
    if ( stream_.state == STREAM_RUNNING )
      errorText_ = "RtApiAlsa::startStream(): the stream is already running!";
    else if ( stream_.state == STREAM_STOPPING || stream_.state == STREAM_CLOSED )
      errorText_ = "RtApiAlsa::startStream(): the stream is stopping or closed!";
    return error( RTAUDIO_WARNING );
  }

  MUTEX_LOCK( &stream_.mutex );

  /*
  #if defined( HAVE_GETTIMEOFDAY )
  gettimeofday( &stream_.lastTickTimestamp, NULL );
  #endif
  */
  
  int result = 0;
  snd_pcm_state_t state;
  AlsaHandle *apiInfo = (AlsaHandle *) stream_.apiHandle;
  snd_pcm_t **handle = (snd_pcm_t **) apiInfo->handles;
  if ( stream_.mode == OUTPUT || stream_.mode == DUPLEX ) {
    state = snd_pcm_state( handle[0] );
    if ( state != SND_PCM_STATE_PREPARED ) {
      result = snd_pcm_prepare( handle[0] );
      if ( result < 0 ) {
        errorStream_ << "RtApiAlsa::startStream: error preparing output pcm device, " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
        goto unlock;
      }
    }
  }

  if ( ( stream_.mode == INPUT || stream_.mode == DUPLEX ) && !apiInfo->synchronized ) {
    result = snd_pcm_drop(handle[1]); // fix to remove stale data received since device has been open
    state = snd_pcm_state( handle[1] );
    if ( state != SND_PCM_STATE_PREPARED ) {
      result = snd_pcm_prepare( handle[1] );
      if ( result < 0 ) {
        errorStream_ << "RtApiAlsa::startStream: error preparing input pcm device, " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
        goto unlock;
      }
    }
  }

  stream_.state = STREAM_RUNNING;

 unlock:
  apiInfo->runnable = true;
  pthread_cond_signal( &apiInfo->runnable_cv );
  MUTEX_UNLOCK( &stream_.mutex );

  if ( result < 0 ) return error( RTAUDIO_SYSTEM_ERROR );
  return RTAUDIO_NO_ERROR;
}